

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quadrule.cpp
# Opt level: O3

void jacobi_ss_compute(int order,double alpha,double beta,double *xtab,double *weight)

{
  undefined1 auVar1 [16];
  double *c;
  double *pdVar2;
  int iVar3;
  ulong uVar4;
  int iVar5;
  long lVar6;
  char *pcVar7;
  undefined4 in_XMM0_Dc;
  undefined4 in_XMM0_Dd;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double local_b8;
  double dp2;
  double p1;
  double local_a0;
  double local_98;
  ulong uStack_90;
  undefined1 local_88 [16];
  double *local_78;
  undefined8 uStack_70;
  undefined1 local_68 [16];
  double *local_58;
  double local_50;
  double local_48;
  double x;
  ulong local_38;
  
  local_68._8_4_ = in_XMM0_Dc;
  local_68._0_8_ = alpha;
  local_68._12_4_ = in_XMM0_Dd;
  if (alpha <= -1.0) {
    std::operator<<((ostream *)&std::cerr,"\n");
    std::operator<<((ostream *)&std::cerr,"JACOBI_SS_COMPUTE - Fatal error!\n");
    pcVar7 = "  -1.0 < ALPHA is required.\n";
  }
  else {
    local_50 = beta;
    if (-1.0 < beta) {
      local_38 = (ulong)(uint)order;
      uVar4 = 0xffffffffffffffff;
      if (-1 < order) {
        uVar4 = local_38 * 8;
      }
      local_58 = (double *)operator_new__(uVar4);
      c = (double *)operator_new__(uVar4);
      local_78 = (double *)((double)local_68._0_8_ + local_50);
      if (0 < order) {
        iVar3 = 0;
        lVar6 = 0;
        do {
          dVar8 = 0.0;
          iVar5 = (int)lVar6;
          if (local_50 - (double)local_68._0_8_ != 0.0 && (double)local_78 != 0.0) {
            dVar8 = ((double)local_78 * (local_50 - (double)local_68._0_8_)) /
                    (((double)iVar5 + (double)local_78) * ((double)(iVar5 + 2) + (double)local_78));
          }
          *(double *)((long)local_58 + lVar6 * 4) = dVar8;
          if (lVar6 == 0) {
            *c = 0.0;
          }
          else {
            dVar8 = (double)iVar3;
            *(double *)((long)c + lVar6 * 4) =
                 ((dVar8 + local_50) * (dVar8 + (double)local_68._0_8_) * dVar8 * 4.0 *
                 ((double)local_78 + dVar8)) /
                 (((double)(iVar5 + -1) + (double)local_78) *
                 ((double)iVar5 + (double)local_78) * ((double)iVar5 + (double)local_78) *
                 ((double)(iVar5 + 1) + (double)local_78));
          }
          lVar6 = lVar6 + 2;
          iVar3 = iVar3 + 1;
        } while (local_38 * 2 != lVar6);
      }
      local_88._8_4_ = local_68._8_4_;
      local_88._0_8_ = (double)local_68._0_8_ + 1.0;
      local_88._12_4_ = local_68._12_4_;
      uStack_70 = local_68._8_8_;
      x = lgamma((double)local_68._0_8_ + 1.0);
      dVar8 = lgamma(local_50 + 1.0);
      x = dVar8 + x;
      dVar8 = lgamma((double)local_78 + 2.0);
      local_98 = exp(x - dVar8);
      x = 1.0;
      if (1 < order) {
        x = 1.0;
        lVar6 = 0;
        do {
          x = x * c[lVar6 + 1];
          lVar6 = lVar6 + 1;
        } while (local_38 - 1 != lVar6);
      }
      dVar8 = exp2((double)local_78 + 1.0);
      auVar1 = local_88;
      if (0 < order) {
        x = x * local_98 * dVar8;
        dVar10 = (double)order;
        dVar9 = ((double)(order + -8) * 0.22) / dVar10 + 1.0;
        dVar8 = (double)(order * order);
        uStack_90 = local_68._8_8_ ^ 0x8000000000000000;
        local_98 = (-((double)local_68._0_8_ * 0.28 + 1.67) / ((double)local_68._0_8_ * 0.37 + 1.0))
                   * dVar9 * ((local_50 * 8.0) / ((local_50 + 6.28) * dVar8) + 1.0);
        dVar17 = (double)local_68._0_8_ + 4.1;
        dVar14 = (double)local_68._0_8_ * 0.12;
        dVar12 = local_50 * 0.012;
        dVar16 = ABS((double)local_68._0_8_);
        dVar13 = ((double)local_68._0_8_ * 0.156 + 1.0) * (double)local_88._0_8_;
        dVar11 = (double)local_68._0_8_ / dVar10;
        dVar15 = ((dVar11 * 0.768) / dVar10 + 2.78 / (double)(order * order + 4)) *
                 (double)local_88._0_8_;
        dVar11 = dVar11 * 0.83 * (local_50 / dVar10) +
                 dVar11 * 0.452 * dVar11 + (local_50 / dVar10) * 0.96 + dVar11 * 1.48 + 1.0;
        local_a0 = (1.0 / (((double)local_68._0_8_ * 8.0) /
                           (((double)local_68._0_8_ + 6.28) * dVar8) + 1.0)) *
                   (1.0 / dVar9) * ((local_50 * 0.37 + 1.0) / (local_50 * 0.28 + 1.67));
        local_88._4_4_ = 0;
        local_88._0_4_ = order - 1;
        local_88._8_8_ = auVar1._8_8_;
        p1 = (1.0 / (((double)local_68._0_8_ * 20.0) / (((double)local_68._0_8_ + 7.5) * dVar8) +
                    1.0)) *
             (1.0 / (((double)(order + -4) * 0.639) / ((double)(order + -4) * 0.71 + 1.0) + 1.0)) *
             ((local_50 * 0.235 + 1.0) / (local_50 * 0.119 + 0.766));
        uVar4 = 1;
        local_78 = weight;
        do {
          iVar3 = (int)uVar4;
          if (iVar3 == 3) {
            dVar9 = (*xtab - dVar8) * local_98 + dVar8;
          }
          else {
            if (iVar3 == 2) {
              dVar9 = (1.0 - dVar8) *
                      (-dVar17 / dVar13) *
                      (((dVar14 + 1.0) * (double)(order + -8) * 0.06) / dVar10 + 1.0) *
                      (((dVar16 * 0.25 + 1.0) * dVar12) / dVar10 + 1.0);
              goto LAB_001e7992;
            }
            dVar9 = (dVar11 - dVar15) / dVar11;
            if (iVar3 != 1) {
              if (uVar4 < (ulong)local_88._0_8_) {
                dVar9 = xtab[uVar4 - 2] * 3.0 + xtab[uVar4 - 3] * -3.0 + xtab[uVar4 - 4];
              }
              else {
                if (uVar4 == local_88._0_8_) {
                  dVar9 = (dVar8 - xtab[local_88._0_8_ - 3]) * p1;
                }
                else {
                  dVar9 = local_48;
                  if (local_38 != uVar4) goto LAB_001e79f2;
                  dVar9 = (dVar8 - xtab[local_38 - 3]) * local_a0;
                }
LAB_001e7992:
                dVar9 = dVar9 + dVar8;
              }
            }
          }
LAB_001e79f2:
          local_48 = dVar9;
          jacobi_ss_root(&local_48,order,(double)local_68._0_8_,local_50,&local_b8,&dp2,local_58,c);
          xtab[uVar4 - 1] = local_48;
          local_78[uVar4 - 1] = x / (local_b8 * dp2);
          uVar4 = uVar4 + 1;
          dVar8 = local_48;
        } while (order + 1 != uVar4);
        if ((int)local_38 != 1) {
          pdVar2 = xtab + local_38;
          uVar4 = 0;
          do {
            pdVar2 = pdVar2 + -1;
            dVar8 = xtab[uVar4];
            xtab[uVar4] = *pdVar2;
            *pdVar2 = dVar8;
            uVar4 = uVar4 + 1;
          } while ((uint)order >> 1 != uVar4);
          pdVar2 = local_78 + local_38;
          uVar4 = 0;
          do {
            pdVar2 = pdVar2 + -1;
            dVar8 = local_78[uVar4];
            local_78[uVar4] = *pdVar2;
            *pdVar2 = dVar8;
            uVar4 = uVar4 + 1;
          } while ((uint)order >> 1 != uVar4);
        }
      }
      operator_delete__(local_58);
      operator_delete__(c);
      return;
    }
    std::operator<<((ostream *)&std::cerr,"\n");
    std::operator<<((ostream *)&std::cerr,"JACOBI_SS_COMPUTE - Fatal error!\n");
    pcVar7 = "  -1.0 < BETA is required.\n";
  }
  std::operator<<((ostream *)&std::cerr,pcVar7);
  exit(1);
}

Assistant:

void jacobi_ss_compute ( int order, double alpha, double beta, double xtab[], 
  double weight[] )

//****************************************************************************80
//
//  Purpose:
//
//    JACOBI_SS_COMPUTE computes a Gauss-Jacobi quadrature rule.
//
//  Discussion:
//
//    The integral:
//
//      Integral ( -1 <= X <= 1 ) (1-X)**ALPHA * (1+X)**BETA * F(X) dX
//
//    The quadrature rule:
//
//      Sum ( 1 <= I <= ORDER ) WEIGHT(I) * F ( XTAB(I) )
//
//    Thanks to Xu Xiang of Fudan University for pointing out that
//    an earlier implementation of this routine was incorrect!
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license. 
//
//  Modified:
//
//    14 May 2007
//
//  Author:
//
//    Original FORTRAN77 version by Arthur Stroud, Don Secrest.
//    C++ version by John Burkardt.
//
//  Reference:
//
//    Arthur Stroud, Don Secrest,
//    Gaussian Quadrature Formulas,
//    Prentice Hall, 1966,
//    LC: QA299.4G3S7.
//
//  Parameters:
//
//    Input, int ORDER, the order.
//
//    Input, double ALPHA, BETA, the exponents of (1-X) and
//    (1+X) in the quadrature rule.  For simple Gauss-Legendre quadrature,
//    set ALPHA = BETA = 0.0.  -1.0 < ALPHA and -1.0 < BETA are required.
//
//    Output, double XTAB[ORDER], the abscissas.
//
//    Output, double WEIGHT[ORDER], the weights.
//
{
  double an;
  double *b;
  double bn;
  double *c;
  double cc;
  double delta;
  double dp2;
  int i;
  double p1;
  double prod;
  double r1;
  double r2;
  double r3;
  double x;
//
//  Check ALPHA and BETA.
//
  if ( alpha <= -1.0 )
  {
    std::cerr << "\n";
    std::cerr << "JACOBI_SS_COMPUTE - Fatal error!\n";
    std::cerr << "  -1.0 < ALPHA is required.\n";
    exit ( 1 );
  }

  if ( beta <= -1.0 )
  {
    std::cerr << "\n";
    std::cerr << "JACOBI_SS_COMPUTE - Fatal error!\n";
    std::cerr << "  -1.0 < BETA is required.\n";
    exit ( 1 );
  }

  b = new double[order];
  c = new double[order];
//
//  Set the recursion coefficients.
//
  for ( i = 1; i <= order; i++ )
  {
    if ( alpha + beta == 0.0 || beta - alpha == 0.0 )
    {
      b[i-1] = 0.0;
    }
    else
    {
      b[i-1] = ( alpha + beta ) * ( beta - alpha ) / 
             ( ( alpha + beta + double( 2 * i ) ) 
             * ( alpha + beta + double( 2 * i - 2 ) ) );
    }

    if ( i == 1 )
    {
      c[i-1] = 0.0;
    }
    else
    {
      c[i-1] = 4.0 * double( i - 1 ) 
         * ( alpha + double( i - 1 ) ) 
          * ( beta + double( i - 1 ) ) 
            * ( alpha + beta + double( i - 1 ) ) / 
            ( ( alpha + beta + double( 2 * i - 1 ) ) 
            * pow ( alpha + beta + double( 2 * i - 2 ), 2 ) 
            * ( alpha + beta + double( 2 * i - 3 ) ) );
    }
  }

  delta = exp ( lgamma ( alpha        + 1.0 ) 
              + lgamma (         beta + 1.0 ) 
              - lgamma ( alpha + beta + 2.0 ) );
  prod = 1.0;
  for ( i = 2; i <= order; i++ )
  {
    prod = prod * c[i-1];
  }
  cc = delta * pow ( 2.0, alpha + beta + 1.0 ) * prod;

  for ( i = 1; i <= order; i++ )
  {
    if ( i == 1 )
    {
      an = alpha / double( order );
      bn = beta / double( order );

      r1 = ( 1.0 + alpha ) 
        * ( 2.78 / ( 4.0 + double( order * order ) ) 
        + 0.768 * an / double( order ) );

      r2 = 1.0 + 1.48 * an + 0.96 * bn 
        + 0.452 * an * an + 0.83 * an * bn;

      x = ( r2 - r1 ) / r2;
    }
    else if ( i == 2 )
    {
      r1 = ( 4.1 + alpha ) / 
        ( ( 1.0 + alpha ) * ( 1.0 + 0.156 * alpha ) );

      r2 = 1.0 + 0.06 * ( double( order ) - 8.0 ) * 
        ( 1.0 + 0.12 * alpha ) / double( order );

      r3 = 1.0 + 0.012 * beta * 
        ( 1.0 + 0.25 * fabs ( alpha ) ) / double( order );

      x = x - r1 * r2 * r3 * ( 1.0 - x );
    }
    else if ( i == 3 )
    {
      r1 = ( 1.67 + 0.28 * alpha ) / ( 1.0 + 0.37 * alpha );

      r2 = 1.0 + 0.22 * ( double( order ) - 8.0 ) 
        / double( order );

      r3 = 1.0 + 8.0 * beta / 
        ( ( 6.28 + beta ) * double( order * order ) );

      x = x - r1 * r2 * r3 * ( xtab[0] - x );
    }
    else if ( i < order - 1 )
    {
      x = 3.0 * xtab[i-2] - 3.0 * xtab[i-3] + xtab[i-4];
    }
    else if ( i == order - 1 )
    {
      r1 = ( 1.0 + 0.235 * beta ) / ( 0.766 + 0.119 * beta );

      r2 = 1.0 / ( 1.0 + 0.639 
        * ( double( order ) - 4.0 ) 
        / ( 1.0 + 0.71 * ( double( order ) - 4.0 ) ) );

      r3 = 1.0 / ( 1.0 + 20.0 * alpha / ( ( 7.5 + alpha ) * 
        double( order * order ) ) );

      x = x + r1 * r2 * r3 * ( x - xtab[i-3] );
    }
    else if ( i == order )
    {
      r1 = ( 1.0 + 0.37 * beta ) / ( 1.67 + 0.28 * beta );

      r2 = 1.0 / 
        ( 1.0 + 0.22 * ( double( order ) - 8.0 ) 
        / double( order ) );

      r3 = 1.0 / ( 1.0 + 8.0 * alpha / 
        ( ( 6.28 + alpha ) * double( order * order ) ) );

      x = x + r1 * r2 * r3 * ( x - xtab[i-3] );
    }
    jacobi_ss_root ( &x, order, alpha, beta, &dp2, &p1, b, c );

    xtab[i-1] = x;
    weight[i-1] = cc / ( dp2 * p1 );
  }
//
//  Reverse the order of the values.
//
  r8vec_reverse ( order, xtab );
  r8vec_reverse ( order, weight );

  delete [] b;
  delete [] c;

  return;
}